

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_impl.hpp
# Opt level: O0

void __thiscall
boost::detail::
sp_counted_impl_p<boost::spirit::classic::impl::object_with_id_base_supply<unsigned_long>_>::dispose
          (sp_counted_impl_p<boost::spirit::classic::impl::object_with_id_base_supply<unsigned_long>_>
           *this)

{
  checked_delete<boost::spirit::classic::impl::object_with_id_base_supply<unsigned_long>>
            ((object_with_id_base_supply<unsigned_long> *)this);
  return;
}

Assistant:

virtual void dispose() // nothrow
    {
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        boost::sp_scalar_destructor_hook( px_, sizeof(X), this );
#endif
        boost::checked_delete( px_ );
    }